

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O3

int send_twin_operation_request
              (TWIN_MESSENGER_INSTANCE_conflict *twin_msgr,TWIN_OPERATION_CONTEXT *op_ctx,
              CONSTBUFFER_HANDLE data)

{
  TWIN_OPERATION_TYPE TVar1;
  int iVar2;
  int iVar3;
  MESSAGE_HANDLE message;
  AMQP_VALUE map;
  LOGGER_LOG p_Var4;
  AMQP_VALUE annotations;
  CONSTBUFFER *pCVar5;
  time_t tVar6;
  char *pcVar7;
  size_t sVar8;
  uchar *puVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  BINARY_DATA amqp_data;
  
  TVar1 = op_ctx->type;
  if (TVar1 - TWIN_OPERATION_TYPE_PATCH < 5) {
    pcVar7 = op_ctx->correlation_id;
    pcVar10 = *(char **)(&DAT_001d4c00 + (ulong)(TVar1 - TWIN_OPERATION_TYPE_PATCH) * 8);
    message = message_create();
    if (message != (MESSAGE_HANDLE)0x0) {
      map = amqpvalue_create_map();
      if (map == (AMQP_VALUE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"create_amqp_message_for_twin_operation",0x2f6,1,
                    "Failed creating map for message annotations");
        }
        message_destroy(message);
        goto LAB_0013a13b;
      }
      iVar2 = add_map_item(map,"operation",pcVar10);
      if (iVar2 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a059;
        pcVar10 = "Failed adding operation to AMQP message annotations (%s)";
        iVar2 = 0x2fe;
        goto LAB_0013a04e;
      }
      if (TVar1 == TWIN_OPERATION_TYPE_PATCH) {
        iVar2 = add_map_item(map,"resource","/properties/reported");
        if (iVar2 == 0) {
LAB_0013a271:
          annotations = amqpvalue_create_message_annotations(map);
          if (annotations == (AMQP_VALUE)0x0) {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              (*p_Var4)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"add_amqp_message_annotation",0x13d,1,
                        "Failed creating new AMQP message annotations");
            }
LAB_0013a314:
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a059;
            pcVar10 = "Failed adding annotations to AMQP message (%s)";
            iVar2 = 0x312;
          }
          else {
            iVar2 = message_set_message_annotations(message,annotations);
            if (iVar2 != 0) {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"add_amqp_message_annotation",0x144,1,
                          "Failed setting AMQP message annotations");
              }
              amqpvalue_destroy(annotations);
              goto LAB_0013a314;
            }
            amqpvalue_destroy(annotations);
            iVar2 = set_message_correlation_id(message,pcVar7);
            if (iVar2 == 0) {
              if (data == (CONSTBUFFER_HANDLE)0x0) {
                sVar8 = 1;
                puVar9 = " ";
              }
              else {
                pCVar5 = CONSTBUFFER_GetContent(data);
                puVar9 = pCVar5->buffer;
                sVar8 = pCVar5->size;
              }
              amqp_data.length = sVar8;
              amqp_data.bytes = puVar9;
              iVar2 = message_add_body_amqp_data(message,amqp_data);
              if (iVar2 == 0) {
                amqpvalue_destroy(map);
                iVar2 = 0;
                tVar6 = get_time((time_t *)0x0);
                op_ctx->time_sent = tVar6;
                if (tVar6 == -1) {
                  p_Var4 = xlogging_get_log_function();
                  iVar2 = 0x3c5;
                  if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a510;
                  pcVar10 = twin_msgr->device_id;
                  if ((ulong)op_ctx->type < 6) {
                    pcVar7 = TWIN_OPERATION_TYPEStringStorage[op_ctx->type];
                  }
                  else {
                    pcVar7 = "NULL";
                  }
                  pcVar11 = op_ctx->correlation_id;
                  pcVar12 = "Failed setting TWIN operation sent time (%s, %s, %s)";
                  iVar3 = 0x3c4;
                }
                else {
                  iVar3 = amqp_messenger_send_async
                                    (twin_msgr->amqp_msgr,message,on_amqp_send_complete_callback,
                                     op_ctx);
                  if (iVar3 == 0) goto LAB_0013a510;
                  p_Var4 = xlogging_get_log_function();
                  iVar2 = 0x3ca;
                  if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a510;
                  pcVar10 = twin_msgr->device_id;
                  if ((ulong)op_ctx->type < 6) {
                    pcVar7 = TWIN_OPERATION_TYPEStringStorage[op_ctx->type];
                  }
                  else {
                    pcVar7 = "NULL";
                  }
                  pcVar11 = op_ctx->correlation_id;
                  pcVar12 = "Failed sending request message for (%s, %s, %s)";
                  iVar3 = 0x3c9;
                }
                (*p_Var4)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"send_twin_operation_request",iVar3,1,pcVar12,pcVar10,pcVar7,pcVar11);
LAB_0013a510:
                message_destroy(message);
                return iVar2;
              }
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                pcVar10 = "Failed adding twin patch data to AMQP message body";
                iVar2 = 0x32f;
                goto LAB_0013a04e;
              }
              goto LAB_0013a059;
            }
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a059;
            pcVar10 = "Failed AMQP message correlation-id (%s)";
            iVar2 = 0x318;
          }
LAB_0013a04e:
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"create_amqp_message_for_twin_operation",iVar2,1,pcVar10);
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar10 = "Failed adding resource to AMQP message annotations (%s)";
            iVar2 = 0x305;
            goto LAB_0013a04e;
          }
        }
      }
      else {
        if (((TVar1 & (TWIN_OPERATION_TYPE_PUT|TWIN_OPERATION_TYPE_GET)) != TWIN_OPERATION_TYPE_PUT)
           || (iVar2 = add_map_item(map,"resource","/notifications/twin/properties/desired"),
              iVar2 == 0)) goto LAB_0013a271;
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failed adding resource to AMQP message annotations (%s)";
          iVar2 = 0x30c;
          goto LAB_0013a04e;
        }
      }
LAB_0013a059:
      message_destroy(message);
      amqpvalue_destroy(map);
      goto LAB_0013a13b;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a13b;
    pcVar7 = "create_amqp_message_for_twin_operation";
    pcVar11 = "Failed creating AMQP message (%s)";
    iVar2 = 0x2ee;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_0013a13b;
    if (TVar1 < (TWIN_OPERATION_TYPE_PUT|TWIN_OPERATION_TYPE_GET)) {
      pcVar10 = TWIN_OPERATION_TYPEStringStorage[TVar1];
    }
    else {
      pcVar10 = "NULL";
    }
    pcVar7 = "get_twin_operation_name";
    pcVar11 = "Unrecognized TWIN operation (%s)";
    iVar2 = 0x2ce;
  }
  (*p_Var4)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
            ,pcVar7,iVar2,1,pcVar11,pcVar10);
LAB_0013a13b:
  p_Var4 = xlogging_get_log_function();
  if (p_Var4 != (LOGGER_LOG)0x0) {
    if ((ulong)op_ctx->type < 6) {
      pcVar10 = TWIN_OPERATION_TYPEStringStorage[op_ctx->type];
    }
    else {
      pcVar10 = "NULL";
    }
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
              ,"send_twin_operation_request",0x3bd,1,"Failed creating request message (%s, %s, %s)",
              twin_msgr->device_id,pcVar10,op_ctx->correlation_id);
  }
  return 0x3be;
}

Assistant:

static int send_twin_operation_request(TWIN_MESSENGER_INSTANCE* twin_msgr, TWIN_OPERATION_CONTEXT* op_ctx, CONSTBUFFER_HANDLE data)
{
    int result;
    MESSAGE_HANDLE amqp_message;

    if ((amqp_message = create_amqp_message_for_twin_operation(op_ctx->type, op_ctx->correlation_id, data)) == NULL)
    {
        LogError("Failed creating request message (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
        result = MU_FAILURE;
    }
    else
    {
        if ((op_ctx->time_sent = get_time(NULL)) == INDEFINITE_TIME)
        {
            LogError("Failed setting TWIN operation sent time (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
            result = MU_FAILURE;
        }
        else if (amqp_messenger_send_async(twin_msgr->amqp_msgr, amqp_message, on_amqp_send_complete_callback, (void*)op_ctx) != 0)
        {
            LogError("Failed sending request message for (%s, %s, %s)", twin_msgr->device_id, MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, op_ctx->type), op_ctx->correlation_id);
            result = MU_FAILURE;
        }
        else
        {
            result = RESULT_OK;
        }

        message_destroy(amqp_message);
    }

    return result;
}